

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O2

void __thiscall zmq::blob_t::set(blob_t *this,uchar *data_,size_t size_)

{
  uchar *__dest;
  
  clear(this);
  __dest = (uchar *)malloc(size_);
  this->_data = __dest;
  if (__dest == (uchar *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/blob.hpp"
            ,0x8e);
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
    __dest = this->_data;
  }
  this->_size = size_;
  this->_owned = true;
  memcpy(__dest,data_,size_);
  return;
}

Assistant:

void set (const unsigned char *const data_, const size_t size_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (size_));
        alloc_assert (_data);
        _size = size_;
        _owned = true;
        memcpy (_data, data_, size_);
    }